

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::Resize
          (TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *this,hash_t nhsize)

{
  bool bVar1;
  FName local_34;
  Node *local_30;
  Node *n;
  Node *nold;
  uint local_18;
  hash_t oldhsize;
  hash_t i;
  hash_t nhsize_local;
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *this_local;
  
  nold._4_4_ = this->Size;
  n = this->Nodes;
  oldhsize = nhsize;
  _i = this;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  for (local_18 = 0; local_18 < nold._4_4_; local_18 = local_18 + 1) {
    bVar1 = Node::IsNil(n + local_18);
    if (!bVar1) {
      FName::FName(&local_34,&n[local_18].Pair.Key);
      local_30 = NewKey(this,&local_34);
      FName::FName(&(local_30->Pair).Value,&n[local_18].Pair.Value);
    }
  }
  M_Free(n);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}